

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O0

void __thiscall
burst::algorithm::
bitap<wchar_t,std::bitset<32ul>,std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>
::bitap<std::__cxx11::wstring>
          (bitap<wchar_t,std::bitset<32ul>,std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>
           *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pattern
          )

{
  element_type *this_00;
  size_t sVar1;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_20;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_18;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pattern_local;
  bitap<wchar_t,_std::bitset<32UL>,_std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>
  *this_local;
  
  local_18 = pattern;
  pattern_local = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)this
  ;
  local_20._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  std::__cxx11::wstring::end();
  std::
  make_shared<burst::algorithm::detail::element_position_bitmask_table<std::map<wchar_t,std::bitset<32ul>,std::less<wchar_t>,std::allocator<std::pair<wchar_t_const,std::bitset<32ul>>>>>const,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
            ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)this,&local_20);
  this_00 = std::
            __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  sVar1 = algorithm::detail::
          element_position_bitmask_table<std::map<wchar_t,_std::bitset<32UL>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::bitset<32UL>_>_>_>_>
          ::length(this_00);
  if (sVar1 < 0x21) {
    return;
  }
  __assert_fail("m_bitmask_table->length() <= bitmask_size",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/searching/bitap.hpp"
                ,0x4c,
                "burst::algorithm::bitap<wchar_t, std::bitset<32>>::bitap(const ForwardRange &) [Value = wchar_t, Bitmask = std::bitset<32>, Map = std::map<wchar_t, std::bitset<32>>, ForwardRange = std::basic_string<wchar_t>]"
               );
}

Assistant:

explicit bitap (const ForwardRange & pattern):
                m_bitmask_table
                (
                    std::make_shared<const bitmask_table_type>(pattern.begin(), pattern.end())
                )
            {
                BOOST_ASSERT(m_bitmask_table->length() <= bitmask_size);
            }